

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall spvtools::opt::IRContext::InitializeCombinators(IRContext *this)

{
  bool bVar1;
  Capability capability_00;
  FeatureManager *this_00;
  CapabilitySet *this_01;
  Instruction *extension_00;
  Instruction *extension;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  undefined1 local_48 [4];
  Capability capability;
  iterator __end2;
  iterator __begin2;
  CapabilitySet *__range2;
  IRContext *this_local;
  
  this_00 = get_feature_mgr(this);
  this_01 = FeatureManager::GetCapabilities(this_00);
  EnumSet<spv::Capability>::begin((iterator *)&__end2.bucketOffset_,this_01);
  EnumSet<spv::Capability>::end((iterator *)local_48,this_01);
  while( true ) {
    bVar1 = EnumSet<spv::Capability>::Iterator::operator!=
                      ((Iterator *)&__end2.bucketOffset_,(Iterator *)local_48);
    if (!bVar1) break;
    capability_00 = EnumSet<spv::Capability>::Iterator::operator*((Iterator *)&__end2.bucketOffset_)
    ;
    AddCombinatorsForCapability(this,capability_00);
    EnumSet<spv::Capability>::Iterator::operator++((Iterator *)&__end2.bucketOffset_);
  }
  module(this);
  Module::ext_inst_imports((Module *)&__begin2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&extension);
  while( true ) {
    bVar1 = utils::operator!=(&__end2_1.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&extension);
    if (!bVar1) break;
    extension_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             (&__end2_1.super_iterator);
    AddCombinatorsForExtension(this,extension_00);
    InstructionList::iterator::operator++(&__end2_1);
  }
  opt::operator|=(&this->valid_analyses_,kAnalysisCombinators);
  return;
}

Assistant:

void IRContext::InitializeCombinators() {
  for (auto capability : get_feature_mgr()->GetCapabilities()) {
    AddCombinatorsForCapability(uint32_t(capability));
  }

  for (auto& extension : module()->ext_inst_imports()) {
    AddCombinatorsForExtension(&extension);
  }

  valid_analyses_ |= kAnalysisCombinators;
}